

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtGhostObject.cpp
# Opt level: O2

void __thiscall
cbtPairCachingGhostObject::cbtPairCachingGhostObject(cbtPairCachingGhostObject *this)

{
  cbtHashedOverlappingPairCache *this_00;
  
  cbtGhostObject::cbtGhostObject(&this->super_cbtGhostObject);
  (this->super_cbtGhostObject).super_cbtCollisionObject._vptr_cbtCollisionObject =
       (_func_int **)&PTR__cbtPairCachingGhostObject_01194dd0;
  this_00 = (cbtHashedOverlappingPairCache *)cbtAlignedAllocInternal(0x78,0x10);
  cbtHashedOverlappingPairCache::cbtHashedOverlappingPairCache(this_00);
  this->m_hashPairCache = this_00;
  return;
}

Assistant:

cbtPairCachingGhostObject::cbtPairCachingGhostObject()
{
	m_hashPairCache = new (cbtAlignedAlloc(sizeof(cbtHashedOverlappingPairCache), 16)) cbtHashedOverlappingPairCache();
}